

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::SkipComment
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *pp,bool *containTypeDef)

{
  byte *pbVar1;
  byte *end;
  code *pcVar2;
  bool bVar3;
  char16 c1;
  undefined4 *puVar4;
  byte *local_38;
  EncodedCharPtr p;
  
  if (containTypeDef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x5a9,"(containTypeDef != nullptr)","containTypeDef != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pbVar1 = *pp;
  *containTypeDef = false;
  end = this->m_pchLast;
LAB_00f16b7e:
  while( true ) {
    local_38 = pbVar1;
    pbVar1 = local_38 + 1;
    if (local_38 < end) {
      c1 = (char16)*local_38;
    }
    else {
      c1 = L'\0';
    }
    if (0xc < (ushort)c1) break;
    if (c1 != L'\0') {
      if (c1 != L'\n') goto LAB_00f16bc5;
      goto LAB_00f16bfd;
    }
    if (end <= pbVar1) {
      this->m_currentCharacter = local_38;
      *pp = local_38;
      local_38 = pbVar1;
      Error(this,-0x7ff5fc08);
    }
  }
  if (c1 != L'\r') {
    if (c1 == L'*') {
      if (*pbVar1 == 0x2f) {
        *pp = local_38 + 2;
        return tkNone;
      }
      goto LAB_00f16b7e;
    }
LAB_00f16bc5:
    if ((ushort)c1 < 0x80) goto LAB_00f16b7e;
    local_38 = pbVar1;
    c1 = utf8::DecodeTail(c1,&local_38,end,
                          &(this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions,(bool *)0x0);
    (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits =
         (size_t)(local_38 +
                 ((this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits - (long)pbVar1));
    pbVar1 = local_38;
    if ((c1 & 0xfffeU) != 0x2028) goto LAB_00f16b7e;
  }
LAB_00f16bfd:
  local_38 = pbVar1;
  this->m_fHadEol = 1;
  this->m_currentCharacter = local_38;
  ScanNewLine(this,(uint)(ushort)c1);
  pbVar1 = this->m_currentCharacter;
  goto LAB_00f16b7e;
}

Assistant:

tokens Scanner<EncodingPolicy>::SkipComment(EncodedCharPtr *pp, /* out */ bool* containTypeDef)
{
    Assert(containTypeDef != nullptr);
    EncodedCharPtr p = *pp;
    *containTypeDef = false;
    EncodedCharPtr last = m_pchLast;
    OLECHAR ch;

    for (;;)
    {
        switch((ch = this->ReadFirst(p, last)))
        {
        case '*':
            if (*p == '/')
            {
                *pp = p + 1;
                return tkNone;
            }
            break;

        // ES 2015 11.3 Line Terminators
        case kchLS:         // 0x2028, classifies as new line
        case kchPS:         // 0x2029, classifies as new line
LEcmaLineBreak:
            goto LLineBreak;

        case kchRET:
        case kchNWL:
LLineBreak:
            m_fHadEol = TRUE;
            m_currentCharacter = p;
            ScanNewLine(ch);
            p = m_currentCharacter;
            break;

        case kchNUL:
            if (p >= last)
            {
                m_currentCharacter = p - 1;
                *pp = p - 1;
                Error(ERRnoCmtEnd);
            }
            break;

        default:
            if (this->IsMultiUnitChar(ch))
            {
                ch = this->template ReadRest<true>(ch, p, last);
                switch (ch)
                {
                case kchLS:
                case kchPS:
                    goto LEcmaLineBreak;
                }
            }
            break;
        }
    }
}